

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31sVertexAttributeBindingTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Stress::anon_unknown_0::SingleBindingCase::createShader(SingleBindingCase *this)

{
  bool bVar1;
  ShaderProgram *this_00;
  RenderContext *renderCtx;
  ProgramSources *pPVar2;
  TestLog *log;
  TestError *this_01;
  allocator<char> local_1a9;
  string local_1a8;
  undefined1 local_182;
  allocator<char> local_181;
  string local_180;
  ShaderSource local_160;
  string local_138;
  ShaderSource local_118;
  ProgramSources local_e0;
  SingleBindingCase *local_10;
  SingleBindingCase *this_local;
  
  local_10 = this;
  this_00 = (ShaderProgram *)operator_new(0xd0);
  local_182 = 1;
  renderCtx = gles31::Context::getRenderContext
                        ((this->super_BindingRenderCase).super_TestCase.m_context);
  glu::ProgramSources::ProgramSources(&local_e0);
  Stress::(anonymous_namespace)::SingleBindingCase::genVertexSource_abi_cxx11_
            (&local_138,(SingleBindingCase *)this);
  glu::VertexSource::VertexSource((VertexSource *)&local_118,&local_138);
  pPVar2 = glu::ProgramSources::operator<<(&local_e0,&local_118);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,
             "#version 310 es\nin mediump vec4 v_color;\nlayout(location = 0) out mediump vec4 fragColor;\nvoid main (void)\n{\n\tfragColor = v_color;\n}\n"
             ,&local_181);
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_160,&local_180);
  pPVar2 = glu::ProgramSources::operator<<(pPVar2,&local_160);
  glu::ShaderProgram::ShaderProgram(this_00,renderCtx,pPVar2);
  local_182 = 0;
  (this->super_BindingRenderCase).m_program = this_00;
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_160);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator(&local_181);
  glu::VertexSource::~VertexSource((VertexSource *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  glu::ProgramSources::~ProgramSources(&local_e0);
  log = tcu::TestContext::getLog
                  ((this->super_BindingRenderCase).super_TestCase.super_TestCase.super_TestNode.
                   m_testCtx);
  glu::operator<<(log,(this->super_BindingRenderCase).m_program);
  bVar1 = glu::ShaderProgram::isOk((this->super_BindingRenderCase).m_program);
  if (!bVar1) {
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a8,"could not build shader",&local_1a9);
    tcu::TestError::TestError(this_01,&local_1a8);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return;
}

Assistant:

void SingleBindingCase::createShader (void)
{
	m_program = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources() << glu::VertexSource(genVertexSource()) << glu::FragmentSource(s_colorFragmentShader));
	m_testCtx.getLog() << *m_program;

	if (!m_program->isOk())
		throw tcu::TestError("could not build shader");
}